

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void __thiscall tcmalloc::SizeMap::Init(SizeMap *this)

{
  LogItem b;
  LogItem b_00;
  LogItem b_01;
  LogItem b_02;
  LogItem b_03;
  LogItem b_04;
  LogItem b_05;
  LogItem b_06;
  LogItem b_07;
  LogItem c_00;
  LogItem c_01;
  LogItem c_02;
  LogItem c_03;
  LogItem c_04;
  LogItem c_05;
  LogItem c_06;
  LogItem c_07;
  LogItem c_08;
  LogItem d;
  LogItem d_00;
  LogItem d_01;
  LogItem d_02;
  LogItem d_03;
  LogItem d_04;
  LogItem d_05;
  LogItem d_06;
  LogItem d_07;
  uchar uVar1;
  int iVar2;
  char *value;
  unsigned_long *puVar3;
  size_t sVar4;
  LogItem a;
  LogItem a_00;
  LogItem a_01;
  LogItem a_02;
  LogItem a_03;
  LogItem a_04;
  LogItem a_05;
  LogItem a_06;
  LogItem a_07;
  ulong local_2e8;
  size_t cl;
  anon_union_8_4_e5b1a622_for_u_ local_2d8;
  LogItem local_2d0;
  LogItem local_2c0;
  LogItem local_2b0;
  ulong local_2a0;
  size_t size_2;
  size_t align;
  anon_union_8_4_e5b1a622_for_u_ local_288;
  LogItem local_280;
  LogItem local_270;
  LogItem local_260;
  ulong local_250;
  size_t s_1;
  anon_union_8_4_e5b1a622_for_u_ local_240;
  LogItem local_238;
  LogItem local_228;
  LogItem local_218;
  LogItem local_208;
  LogItem local_1f8;
  LogItem local_1e8;
  LogItem local_1d8;
  int local_1c4;
  ulong uStack_1c0;
  int sc_1;
  size_t size_1;
  int s;
  int max_size_in_class;
  int c;
  int next_size;
  anon_union_8_4_e5b1a622_for_u_ local_1a0;
  LogItem local_198;
  LogItem local_188;
  LogItem local_178;
  ulong local_168;
  size_t prev_objects;
  size_t my_objects;
  size_t my_pages;
  size_t psize;
  undefined1 auStack_140 [4];
  int blocks_to_move;
  anon_union_8_4_e5b1a622_for_u_ local_138;
  LogItem local_130;
  LogItem local_120;
  LogItem local_110;
  ulong local_100;
  size_t size;
  int alignment;
  int sc;
  anon_union_8_4_e5b1a622_for_u_ local_e8;
  LogItem local_e0;
  LogItem local_d0;
  LogItem local_c0;
  LogItem local_b0;
  LogItem local_a0;
  LogItem local_90;
  LogItem local_80;
  LogItem local_70;
  LogItem local_60;
  LogItem local_50;
  LogItem local_40;
  ulong local_30;
  size_t min_span_size;
  size_t native_page_size;
  SizeMap *this_local;
  SizeMap *local_10;
  
  native_page_size = (size_t)this;
  InitTCMallocTransferNumObjects();
  value = TCMallocGetenvSafe("TCMALLOC_OVERRIDE_PAGESIZE");
  iVar2 = getpagesize();
  min_span_size = commandlineflags::StringToLongLong(value,(long)iVar2);
  puVar3 = std::max<unsigned_long>(&min_span_size,&kPageSize);
  local_30 = *puVar3;
  if ((0x2000 < local_30) && ((local_30 & 0x1fff) != 0)) {
    LogItem::LogItem(&local_40,
                     "This should never happen, but somehow we got systems page size not power of 2 and not multiple of malloc\'s logical page size. Releasing memory back will mostly not happen. system: "
                    );
    LogItem::LogItem(&local_50,min_span_size);
    LogItem::LogItem(&local_60,", malloc: ");
    LogItem::LogItem(&local_70,0x2000);
    a._4_4_ = 0;
    a.tag_ = local_40.tag_;
    b.u_.str = local_50.u_.str;
    b.tag_ = local_50.tag_;
    b._4_4_ = local_50._4_4_;
    c_00.u_.str = local_60.u_.str;
    c_00.tag_ = local_60.tag_;
    c_00._4_4_ = local_60._4_4_;
    d.u_.str = local_70.u_.str;
    d.tag_ = local_70.tag_;
    d._4_4_ = local_70._4_4_;
    a.u_.str = local_40.u_.str;
    Log(kLog,"/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
        ,0x95,a,b,c_00,d);
    local_30 = 0x2000;
  }
  this->min_span_size_in_pages_ = local_30 >> 0xd;
  sVar4 = ClassIndex(0);
  if (sVar4 != 0) {
    LogItem::LogItem(&local_80,"Invalid class index for size 0");
    sVar4 = ClassIndex(0);
    LogItem::LogItem(&local_90,sVar4);
    LogItem::LogItem(&local_a0);
    LogItem::LogItem(&local_b0);
    a_00._4_4_ = 0;
    a_00.tag_ = local_80.tag_;
    b_00.u_.str = local_90.u_.str;
    b_00.tag_ = local_90.tag_;
    b_00._4_4_ = local_90._4_4_;
    c_01.u_.str = local_a0.u_.str;
    c_01.tag_ = local_a0.tag_;
    c_01._4_4_ = local_a0._4_4_;
    d_00.u_.str = local_b0.u_.str;
    d_00.tag_ = local_b0.tag_;
    d_00._4_4_ = local_b0._4_4_;
    a_00.u_.str = local_80.u_.str;
    Log(kCrash,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",0xa0
        ,a_00,b_00,c_01,d_00);
  }
  sVar4 = ClassIndex(0x40000);
  if (0x878 < sVar4) {
    LogItem::LogItem(&local_c0,"Invalid class index for kMaxSize");
    sVar4 = ClassIndex(0x40000);
    LogItem::LogItem(&local_d0,sVar4);
    LogItem::LogItem(&local_e0);
    LogItem::LogItem((LogItem *)&alignment);
    a_01._4_4_ = 0;
    a_01.tag_ = local_c0.tag_;
    b_01.u_.str = local_d0.u_.str;
    b_01.tag_ = local_d0.tag_;
    b_01._4_4_ = local_d0._4_4_;
    c_02.u_.str = local_e0.u_.str;
    c_02.tag_ = local_e0.tag_;
    c_02._4_4_ = local_e0._4_4_;
    d_01.u_.str = local_e8.str;
    d_01.tag_ = alignment;
    d_01._4_4_ = sc;
    a_01.u_.str = local_c0.u_.str;
    Log(kCrash,
        "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",0xa4
        ,a_01,b_01,c_02,d_01);
  }
  size._4_4_ = 1;
  size._0_4_ = 8;
  local_100 = 8;
  do {
    if (0x40000 < local_100) {
      this->num_size_classes = (long)(int)size._4_4_;
      if (0x80 < size._4_4_) {
        LogItem::LogItem(&local_178,"too many size classes: (found vs. max)");
        LogItem::LogItem(&local_188,size._4_4_);
        LogItem::LogItem(&local_198,0x80);
        LogItem::LogItem((LogItem *)&c);
        a_03._4_4_ = 0;
        a_03.tag_ = local_178.tag_;
        b_03.u_.str = local_188.u_.str;
        b_03.tag_ = local_188.tag_;
        b_03._4_4_ = local_188._4_4_;
        c_04.u_.str = local_198.u_.str;
        c_04.tag_ = local_198.tag_;
        c_04._4_4_ = local_198._4_4_;
        d_03.u_.str = local_1a0.str;
        d_03.tag_ = c;
        d_03._4_4_ = next_size;
        a_03.u_.str = local_178.u_.str;
        Log(kCrash,
            "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
            0xd3,a_03,b_03,c_04,d_03);
      }
      max_size_in_class = 0;
      for (s = 1; (ulong)(long)s < this->num_size_classes; s = s + 1) {
        size_1._4_4_ = this->class_to_size_[s];
        for (size_1._0_4_ = max_size_in_class; (int)size_1 <= size_1._4_4_;
            size_1._0_4_ = (int)size_1 + 8) {
          uVar1 = (uchar)s;
          sVar4 = ClassIndex((long)(int)size_1);
          this->class_array_[sVar4] = uVar1;
        }
        max_size_in_class = size_1._4_4_ + 8;
      }
      uStack_1c0 = 0;
      while (uStack_1c0 < 0x40001) {
        local_1c4 = SizeClass(this,uStack_1c0);
        if ((local_1c4 < 1) || (this->num_size_classes <= (ulong)(long)local_1c4)) {
          LogItem::LogItem(&local_1d8,"Bad size class (class, size)");
          LogItem::LogItem(&local_1e8,local_1c4);
          LogItem::LogItem(&local_1f8,uStack_1c0);
          LogItem::LogItem(&local_208);
          a_04._4_4_ = 0;
          a_04.tag_ = local_1d8.tag_;
          b_04.u_.str = local_1e8.u_.str;
          b_04.tag_ = local_1e8.tag_;
          b_04._4_4_ = local_1e8._4_4_;
          c_05.u_.str = local_1f8.u_.str;
          c_05.tag_ = local_1f8.tag_;
          c_05._4_4_ = local_1f8._4_4_;
          d_04.u_.str = local_208.u_.str;
          d_04.tag_ = local_208.tag_;
          d_04._4_4_ = local_208._4_4_;
          a_04.u_.str = local_1d8.u_.str;
          Log(kCrash,
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
              ,0xe5,a_04,b_04,c_05,d_04);
        }
        if ((1 < local_1c4) && (uStack_1c0 <= (ulong)(long)this->class_to_size_[local_1c4 + -1])) {
          LogItem::LogItem(&local_218,"Allocating unnecessarily large class (class, size)");
          LogItem::LogItem(&local_228,local_1c4);
          LogItem::LogItem(&local_238,uStack_1c0);
          LogItem::LogItem((LogItem *)&s_1);
          a_05._4_4_ = 0;
          a_05.tag_ = local_218.tag_;
          b_05.u_.str = local_228.u_.str;
          b_05.tag_ = local_228.tag_;
          b_05._4_4_ = local_228._4_4_;
          c_06.u_.str = local_238.u_.str;
          c_06.tag_ = local_238.tag_;
          c_06._4_4_ = local_238._4_4_;
          d_05.u_.str = local_240.str;
          d_05._0_8_ = s_1;
          a_05.u_.str = local_218.u_.str;
          Log(kCrash,
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
              ,0xe9,a_05,b_05,c_06,d_05);
        }
        local_250 = (ulong)this->class_to_size_[local_1c4];
        if ((local_250 < uStack_1c0) || (local_250 == 0)) {
          LogItem::LogItem(&local_260,"Bad (class, size, requested)");
          LogItem::LogItem(&local_270,local_1c4);
          LogItem::LogItem(&local_280,local_250);
          LogItem::LogItem((LogItem *)&align,uStack_1c0);
          a_06._4_4_ = 0;
          a_06.tag_ = local_260.tag_;
          b_06.u_.str = local_270.u_.str;
          b_06.tag_ = local_270.tag_;
          b_06._4_4_ = local_270._4_4_;
          c_07.u_.str = local_280.u_.str;
          c_07.tag_ = local_280.tag_;
          c_07._4_4_ = local_280._4_4_;
          d_06.u_.str = local_288.str;
          d_06._0_8_ = align;
          a_06.u_.str = local_260.u_.str;
          Log(kCrash,
              "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
              ,0xee,a_06,b_06,c_07,d_06);
        }
        if (uStack_1c0 < 0x401) {
          uStack_1c0 = uStack_1c0 + 8;
        }
        else {
          uStack_1c0 = uStack_1c0 + 0x80;
        }
      }
      size_2 = 0x10;
      do {
        if (0x2000 < size_2) {
          for (local_2e8 = 1; local_2e8 < this->num_size_classes; local_2e8 = local_2e8 + 1) {
            this_local._4_4_ = (undefined4)local_2e8;
            local_10 = this;
            iVar2 = NumMoveSize(this,(long)this->class_to_size_[local_2e8 & 0xffffffff]);
            this->num_objects_to_move_[local_2e8] = iVar2;
          }
          return;
        }
        for (local_2a0 = size_2; local_2a0 < 0x2000; local_2a0 = size_2 + local_2a0) {
          iVar2 = SizeClass(this,local_2a0);
          if ((ulong)(long)this->class_to_size_[iVar2] % size_2 != 0) {
            LogItem::LogItem(&local_2b0,"class_to_size_[SizeClass(size)] % align == 0");
            LogItem::LogItem(&local_2c0);
            LogItem::LogItem(&local_2d0);
            LogItem::LogItem((LogItem *)&cl);
            a_07._4_4_ = 0;
            a_07.tag_ = local_2b0.tag_;
            b_07.u_.str = local_2c0.u_.str;
            b_07.tag_ = local_2c0.tag_;
            b_07._4_4_ = local_2c0._4_4_;
            c_08.u_.str = local_2d0.u_.str;
            c_08.tag_ = local_2d0.tag_;
            c_08._4_4_ = local_2d0._4_4_;
            d_07.u_.str = local_2d8.str;
            d_07._0_8_ = cl;
            a_07.u_.str = local_2b0.u_.str;
            Log(kCrash,
                "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc"
                ,0x103,a_07,b_07,c_08,d_07);
            do {
            } while( true );
          }
        }
        size_2 = size_2 << 1;
      } while( true );
    }
    size._0_4_ = AlignmentForSize(local_100);
    if (local_100 % (ulong)(long)(int)size != 0) {
      LogItem::LogItem(&local_110,"(size % alignment) == 0");
      LogItem::LogItem(&local_120);
      LogItem::LogItem(&local_130);
      LogItem::LogItem((LogItem *)auStack_140);
      a_02._4_4_ = 0;
      a_02.tag_ = local_110.tag_;
      b_02.u_.str = local_120.u_.str;
      b_02.tag_ = local_120.tag_;
      b_02._4_4_ = local_120._4_4_;
      c_03.u_.str = local_130.u_.str;
      c_03.tag_ = local_130.tag_;
      c_03._4_4_ = local_130._4_4_;
      d_02.u_.str = local_138.str;
      d_02.tag_ = (Tag)auStack_140;
      d_02._4_4_ = blocks_to_move;
      a_02.u_.str = local_110.u_.str;
      Log(kCrash,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/common.cc",
          0xae,a_02,b_02,c_03,d_02);
      do {
      } while( true );
    }
    iVar2 = NumMoveSize(this,local_100);
    psize._4_4_ = iVar2 / 4;
    my_pages = 0;
    do {
      do {
        my_pages = local_30 + my_pages;
      } while (my_pages >> 3 < my_pages % local_100);
    } while (my_pages / local_100 < (ulong)(long)psize._4_4_);
    my_objects = my_pages >> 0xd;
    if (((int)size._4_4_ < 2) || (my_objects != this->class_to_pages_[(int)(size._4_4_ - 1)])) {
LAB_0012d680:
      this->class_to_pages_[(int)size._4_4_] = my_objects;
      this->class_to_size_[(int)size._4_4_] = (int32_t)local_100;
      size._4_4_ = size._4_4_ + 1;
    }
    else {
      prev_objects = (my_objects << 0xd) / local_100;
      local_168 = (this->class_to_pages_[(int)(size._4_4_ - 1)] << 0xd) /
                  (ulong)(long)this->class_to_size_[(int)(size._4_4_ - 1)];
      if (prev_objects != local_168) goto LAB_0012d680;
      this->class_to_size_[(int)(size._4_4_ - 1)] = (int32_t)local_100;
    }
    local_100 = (long)(int)size + local_100;
  } while( true );
}

Assistant:

void SizeMap::Init() {
  InitTCMallocTransferNumObjects();

#if (!defined(_WIN32) || defined(TCMALLOC_BRAVE_EFFECTIVE_PAGE_SIZE)) && !defined(TCMALLOC_COWARD_EFFECTIVE_PAGE_SIZE)
  size_t native_page_size = tcmalloc::commandlineflags::StringToLongLong(
    TCMallocGetenvSafe("TCMALLOC_OVERRIDE_PAGESIZE"), getpagesize());
#else
  // So windows getpagesize() returns 64k. Because that is
  // "granularity size" w.r.t. their virtual memory facility. So kinda
  // maybe not a bad idea to also have effective logical pages at 64k
  // too. But it breaks frag_unittest (for mostly harmless
  // reason). And I am not brave enough to have our behavior change so
  // much on windows (which isn't that much; people routinely run 256k
  // logical pages anyways).
  constexpr size_t native_page_size = kPageSize;
#endif

  size_t min_span_size = std::max<size_t>(native_page_size, kPageSize);
  if (min_span_size > kPageSize && (min_span_size % kPageSize) != 0) {
    Log(kLog, __FILE__, __LINE__, "This should never happen, but somehow "
        "we got systems page size not power of 2 and not multiple of "
        "malloc's logical page size. Releasing memory back will mostly not happen. "
        "system: ", native_page_size, ", malloc: ", kPageSize);
    min_span_size = kPageSize;
  }

  min_span_size_in_pages_ = min_span_size / kPageSize;

  // Do some sanity checking on add_amount[]/shift_amount[]/class_array[]
  if (ClassIndex(0) != 0) {
    Log(kCrash, __FILE__, __LINE__,
        "Invalid class index for size 0", ClassIndex(0));
  }
  if (ClassIndex(kMaxSize) >= sizeof(class_array_)) {
    Log(kCrash, __FILE__, __LINE__,
        "Invalid class index for kMaxSize", ClassIndex(kMaxSize));
  }

  // Compute the size classes we want to use
  int sc = 1;   // Next size class to assign
  int alignment = kAlignment;
  CHECK_CONDITION(kAlignment <= kMinAlign);
  for (size_t size = kAlignment; size <= kMaxSize; size += alignment) {
    alignment = AlignmentForSize(size);
    CHECK_CONDITION((size % alignment) == 0);

    int blocks_to_move = NumMoveSize(size) / 4;
    size_t psize = 0;
    do {
      psize += min_span_size;
      // Allocate enough pages so leftover is less than 1/8 of total.
      // This bounds wasted space to at most 12.5%.
      while ((psize % size) > (psize >> 3)) {
        psize += min_span_size;
      }
      // Continue to add pages until there are at least as many objects in
      // the span as are needed when moving objects from the central
      // freelists and spans to the thread caches.
    } while ((psize / size) < (blocks_to_move));
    const size_t my_pages = psize >> kPageShift;

    if (sc > 1 && my_pages == class_to_pages_[sc-1]) {
      // See if we can merge this into the previous class without
      // increasing the fragmentation of the previous class.
      const size_t my_objects = (my_pages << kPageShift) / size;
      const size_t prev_objects = (class_to_pages_[sc-1] << kPageShift)
                                  / class_to_size_[sc-1];
      if (my_objects == prev_objects) {
        // Adjust last class to include this size
        class_to_size_[sc-1] = size;
        continue;
      }
    }

    // Add new class
    class_to_pages_[sc] = my_pages;
    class_to_size_[sc] = size;
    sc++;
  }
  num_size_classes = sc;
  if (sc > kClassSizesMax) {
    Log(kCrash, __FILE__, __LINE__,
        "too many size classes: (found vs. max)", sc, kClassSizesMax);
  }

  // Initialize the mapping arrays
  int next_size = 0;
  for (int c = 1; c < num_size_classes; c++) {
    const int max_size_in_class = class_to_size_[c];
    for (int s = next_size; s <= max_size_in_class; s += kAlignment) {
      class_array_[ClassIndex(s)] = c;
    }
    next_size = max_size_in_class + kAlignment;
  }

  // Double-check sizes just to be safe
  for (size_t size = 0; size <= kMaxSize;) {
    const int sc = SizeClass(size);
    if (sc <= 0 || sc >= num_size_classes) {
      Log(kCrash, __FILE__, __LINE__,
          "Bad size class (class, size)", sc, size);
    }
    if (sc > 1 && size <= class_to_size_[sc-1]) {
      Log(kCrash, __FILE__, __LINE__,
          "Allocating unnecessarily large class (class, size)", sc, size);
    }
    const size_t s = class_to_size_[sc];
    if (size > s || s == 0) {
      Log(kCrash, __FILE__, __LINE__,
          "Bad (class, size, requested)", sc, s, size);
    }
    if (size <= kMaxSmallSize) {
      size += 8;
    } else {
      size += 128;
    }
  }

  // Our fast-path aligned allocation functions rely on 'naturally
  // aligned' sizes to produce aligned addresses. Lets check if that
  // holds for size classes that we produced.
  //
  // I.e. we're checking that
  //
  // align = (1 << shift), malloc(i * align) % align == 0,
  //
  // for all align values up to kPageSize.
  for (size_t align = kMinAlign; align <= kPageSize; align <<= 1) {
    for (size_t size = align; size < kPageSize; size += align) {
      CHECK_CONDITION(class_to_size_[SizeClass(size)] % align == 0);
    }
  }

  // Initialize the num_objects_to_move array.
  for (size_t cl = 1; cl  < num_size_classes; ++cl) {
    num_objects_to_move_[cl] = NumMoveSize(ByteSizeForClass(cl));
  }
}